

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O3

bool __thiscall mkvmuxer::Segment::UpdateChunkName(Segment *this,char *ext,char **name)

{
  char *__s;
  size_t sVar1;
  size_t sVar2;
  char *__dest;
  bool bVar3;
  char ext_chk [64];
  char acStack_68 [64];
  
  if (ext == (char *)0x0 || name == (char **)0x0) {
    bVar3 = false;
  }
  else {
    snprintf(acStack_68,0x40,"_%06d.%s",(ulong)(uint)this->chunk_count_,ext);
    __s = this->chunking_base_name_;
    sVar1 = strlen(__s);
    sVar2 = strlen(acStack_68);
    __dest = (char *)operator_new__(sVar1 + sVar2 + 1,(nothrow_t *)&std::nothrow);
    bVar3 = __dest != (char *)0x0;
    if (bVar3) {
      strcpy(__dest,__s);
      strcat(__dest,acStack_68);
      if (*name != (char *)0x0) {
        operator_delete__(*name);
      }
      *name = __dest;
    }
  }
  return bVar3;
}

Assistant:

bool Segment::UpdateChunkName(const char* ext, char** name) const {
  if (!name || !ext)
    return false;

  char ext_chk[64];
#ifdef _MSC_VER
  sprintf_s(ext_chk, sizeof(ext_chk), "_%06d.%s", chunk_count_, ext);
#else
  snprintf(ext_chk, sizeof(ext_chk), "_%06d.%s", chunk_count_, ext);
#endif

  const size_t length = strlen(chunking_base_name_) + strlen(ext_chk) + 1;
  char* const str = new (std::nothrow) char[length];  // NOLINT
  if (!str)
    return false;

#ifdef _MSC_VER
  strcpy_s(str, length - strlen(ext_chk), chunking_base_name_);
  strcat_s(str, length, ext_chk);
#else
  strcpy(str, chunking_base_name_);
  strcat(str, ext_chk);
#endif

  delete[] * name;
  *name = str;

  return true;
}